

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_compare_root_file_Test::TestBody
          (portability_path_test_portability_path_test_compare_root_file_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  AssertHelper in_stack_ffffffffffffffc0;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffc8;
  AssertionResult local_18;
  
  portability_path_compare("/a","/");
  this_00 = &local_18;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffffc8._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(char *)in_stack_ffffffffffffffc0.data_,
             (int *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x120b17);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x2ae,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::Message::~Message((Message *)0x120b63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120ba3);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_compare_root_file)
{
	static const char left[] = "/a";
	static const char right[] = "/";

	EXPECT_EQ((int)1, (int)portability_path_compare(left, right));
}